

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O3

_Bool sx_os_rename(char *src,char *dest)

{
  int iVar1;
  
  iVar1 = rename(src,dest);
  return iVar1 == 0;
}

Assistant:

bool sx_os_rename(const char* src, const char* dest)
{
#if SX_PLATFORM_WINDOWS
    return MoveFileExA(src, dest, MOVEFILE_WRITE_THROUGH | MOVEFILE_REPLACE_EXISTING) ? true
                                                                                      : false;
#else
    return rename(src, dest) == 0;
#endif
}